

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.cpp
# Opt level: O0

void __thiscall llvm::Twine::print(Twine *this,raw_ostream *OS)

{
  Child CVar1;
  NodeKind NVar2;
  raw_ostream *OS_local;
  Twine *this_local;
  
  CVar1 = this->LHS;
  NVar2 = getLHSKind(this);
  printOneChild(this,OS,CVar1,NVar2);
  CVar1 = this->RHS;
  NVar2 = getRHSKind(this);
  printOneChild(this,OS,CVar1,NVar2);
  return;
}

Assistant:

void Twine::print(raw_ostream &OS) const {
  printOneChild(OS, LHS, getLHSKind());
  printOneChild(OS, RHS, getRHSKind());
}